

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void basic_suite::api_copy_ctor(void)

{
  undefined4 local_304;
  size_type local_300;
  undefined4 local_2f4;
  value local_2f0 [2];
  undefined1 local_2e8 [8];
  reader copy;
  size_type local_198 [2];
  undefined4 local_188;
  value local_184 [5];
  basic_string_view<char,_std::char_traits<char>_> local_170;
  undefined1 local_160 [8];
  reader reader;
  char input [9];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x5d206c6c756e205b;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_170,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_160,&local_170);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_184[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_188 = 5;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x26,"void basic_suite::api_copy_ctor()",local_184,&local_188);
  local_198[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  copy.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x27,"void basic_suite::api_copy_ctor()",local_198,
             (undefined1 *)
             ((long)&copy.stack.c.
                     super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_2e8,(basic_reader<char> *)local_160);
  local_2f0[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_2f4 = 5;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x29,"void basic_suite::api_copy_ctor()",local_2f0,&local_2f4);
  local_300 = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_304 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x2a,"void basic_suite::api_copy_ctor()",&local_300,&local_304);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_2e8);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_160);
  return;
}

Assistant:

void api_copy_ctor()
{
    const char input[] = "[ null ]";
    json::reader reader(input);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::null);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    json::reader copy(reader);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::null);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
}